

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::FindObjectHelper<true,false>
              (RecyclableObject *obj,int64 length,int64 start,RecyclableObject *callBackFn,
              Var thisArg,ScriptContext *scriptContext)

{
  ThreadContext *this;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined1 *puVar4;
  undefined4 *puVar5;
  Var pvVar6;
  uint64 uVar7;
  uint64 uVar8;
  JavascriptMethod p_Var9;
  uint32 index;
  ulong uVar10;
  undefined1 local_58 [8];
  JsReentLock jsReentLock;
  
  local_58 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_58)->noJsReentrancy;
  ((ThreadContext *)local_58)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_58,obj);
  puVar4 = &DAT_10000ffffffff;
  if ((long)(start & 0xffffffffU) < length) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar10 = start & 0xffffffffU;
    do {
      *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      index = (uint32)start;
      pvVar6 = JavascriptOperators::GetItem(obj,index,scriptContext);
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      *(bool *)((long)local_58 + 0x108) = true;
      if ((int)index < 0) {
        jsReentLock._24_8_ = (BADTYPE)(start & 0xffffffff);
        uVar7 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_);
        bVar2 = NumberUtilities::IsNan((double)jsReentLock._24_8_);
        if (((bVar2) &&
            (uVar8 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_),
            uVar8 != 0xfff8000000000000)) &&
           (uVar8 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_),
           uVar8 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
        jsReentLock._24_8_ = uVar7 ^ 0xfffc000000000000;
      }
      else {
        jsReentLock._24_8_ = uVar10 | 0x1000000000000;
      }
      *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      this = scriptContext->threadContext;
      bVar2 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      if (scriptContext->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var9 = RecyclableObject::GetEntryPoint(callBackFn);
      CheckIsExecutable(callBackFn,p_Var9);
      p_Var9 = RecyclableObject::GetEntryPoint(callBackFn);
      pvVar6 = (*p_Var9)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,thisArg,pvVar6,
                         jsReentLock._24_8_,obj);
      this->reentrancySafeOrHandled = bVar2;
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      puVar4 = (undefined1 *)jsReentLock._24_8_;
      *(bool *)((long)local_58 + 0x108) = true;
      BVar3 = JavascriptConversion::ToBoolean(pvVar6,scriptContext);
      if (BVar3 != 0) goto LAB_00baa001;
      start = (int64)(index + 1);
      uVar10 = start;
    } while ((ulong)start < (ulong)length);
    puVar4 = &DAT_10000ffffffff;
  }
LAB_00baa001:
  *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return puVar4;
}

Assistant:

Var JavascriptArray::FindObjectHelper(RecyclableObject* obj, int64 length, int64 start, RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        Var testResult = nullptr;
        uint32 loopStart = reversed ? (uint32)length - 1 : (uint32)start;
        int8 loopDelta = reversed ? -1 : 1;

        for (uint32 k = loopStart; k < length; k += loopDelta)
        {
            JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, k, scriptContext));
            Var index = JavascriptNumber::ToVar(k, scriptContext);

            JS_REENTRANT(jsReentLock,
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                            element,
                            index,
                            obj);
                }
                END_SAFE_REENTRANT_CALL
            );

            if (JavascriptConversion::ToBoolean(testResult, scriptContext))
            {
                return findIndex ? index : element;
            }
        }

        return findIndex ? JavascriptNumber::ToVar(-1, scriptContext) : scriptContext->GetLibrary()->GetUndefined();
    }